

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::yield_leadership(raft_server *this,bool immediate_yield,int successor_id)

{
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  int32 iVar4;
  int iVar5;
  iterator iVar6;
  uint64_t uVar7;
  uint uVar8;
  _Hash_node_base *p_Var9;
  string candidate_endpoint;
  unique_lock<std::recursive_mutex> guard;
  __atomic_base<int> local_9c;
  undefined1 local_98 [48];
  string local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  unique_lock<std::recursive_mutex> local_40;
  
  if (((this->write_paused_)._M_base._M_i & 1U) != 0) {
    return;
  }
  if (this->id_ != (this->leader_).super___atomic_base<int>._M_i) {
    return;
  }
  local_9c._M_i = successor_id;
  iVar4 = get_num_voting_members(this);
  if (iVar4 < 2) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar5 = (*peVar3->_vptr_logger[7])();
    if (iVar5 < 2) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)(local_98 + 0x30),
               "this node is the only node in the cluster, will do nothing");
    (*peVar3->_vptr_logger[8])
              (peVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"yield_leadership",0x4a1,(string *)(local_98 + 0x30));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    operator_delete(local_68._M_dataplus._M_p);
    return;
  }
  local_40._M_device = &this->lock_;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  local_40._M_owns = true;
  if (immediate_yield) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)(local_98 + 0x30),"got immediate re-elect request, resign now");
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4a8,local_98 + 0x30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    LOCK();
    (this->leader_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    become_follower(this);
    LOCK();
    (this->hb_alive_)._M_base._M_i = false;
    UNLOCK();
    goto LAB_0015332e;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  context::get_params((context *)local_98);
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (long)*(int *)&((element_type *)(local_98._0_8_ + 8))->_vptr_state_mgr;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if ((local_9c._M_i < 0) ||
     (iVar6 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->peers_)._M_h,&local_9c._M_i),
     iVar6.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
     _M_cur == (__node_type *)0x0)) {
    local_98._32_8_ = (element_type *)0x0;
    local_98._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00153157:
    uVar8 = 0xffffffff;
    for (p_Var9 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
        p_Var9 = p_Var9->_M_nxt) {
      uVar1 = *(uint *)&p_Var9[1]._M_nxt;
      uVar7 = timer_helper::get_us((timer_helper *)(p_Var9[2]._M_nxt + 0x28));
      if ((uVar1 != this->id_) &&
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar7 / 1000) <= local_48)) {
        uVar2 = *(uint *)((long)&(p_Var9[2]._M_nxt)->_M_nxt[9]._M_nxt + 4);
        if ((int)local_98._32_4_ < (int)uVar2) {
          std::__cxx11::string::_M_assign((string *)(local_98 + 0x30));
          local_98._32_8_ = ZEXT48(uVar2);
          uVar8 = uVar1;
          local_98._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar7 / 1000);
        }
      }
    }
  }
  else {
    uVar8 = *(uint *)((long)iVar6.
                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                            ._M_cur + 8);
    local_98._32_8_ =
         ZEXT48(*(uint *)(**(long **)((long)iVar6.
                                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                            ._M_cur + 0x10) + 0x4c));
    std::__cxx11::string::_M_assign((string *)(local_98 + 0x30));
    uVar7 = timer_helper::get_us
                      ((timer_helper *)
                       (*(long *)((long)iVar6.
                                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                        ._M_cur + 0x10) + 0x140));
    local_98._40_8_ = uVar7 / 1000;
    if (uVar8 == 0xffffffff) goto LAB_00153157;
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_9c._M_i < 0) {
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,"got graceful re-elect request, pause write from now");
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4e1,local_98);
      goto LAB_0015322b;
    }
  }
  else {
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,
                 "got graceful re-elect request (designated successor %d), pause write from now");
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4d9,local_98);
      if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    if ((((-1 < local_9c._M_i) && (local_9c._M_i != uVar8)) &&
        (peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar3 != (element_type *)0x0)) && (iVar5 = (*peVar3->_vptr_logger[7])(), 2 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,"could not find given successor %d",(ulong)(uint)local_9c._M_i);
      (*peVar3->_vptr_logger[8])
                (peVar3,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4dd,local_98);
LAB_0015322b:
      if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)uVar8 < 0) {
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 2 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,
                 "cannot find valid candidate for next leader, will proceed anyway");
      (*peVar3->_vptr_logger[8])
                (peVar3,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4eb,local_98);
      if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
  }
  else {
    if ((peVar3 != (element_type *)0x0) && (iVar5 = (*peVar3->_vptr_logger[7])(), 3 < iVar5)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_98,
                 "next leader candidate: id %d endpoint %s priority %d last response %lu ms ago",
                 (ulong)uVar8,local_68._M_dataplus._M_p,local_98._32_8_,local_98._40_8_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"yield_leadership",0x4e8,local_98);
      if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    LOCK();
    (this->next_leader_candidate_).super___atomic_base<int>._M_i = uVar8;
    UNLOCK();
  }
  LOCK();
  (this->write_paused_)._M_base._M_i = true;
  UNLOCK();
  context::get_params((context *)local_98);
  timer_helper::set_duration_us(&this->reelection_timer_,(long)*(int *)local_98._0_8_ * 1000);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  timer_helper::reset(&this->reelection_timer_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
LAB_0015332e:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void raft_server::yield_leadership(bool immediate_yield,
                                   int successor_id)
{
    // Leader reelection is already happening.
    if (write_paused_) return;

    // Not a leader, do nothing.
    if (id_ != leader_) return;

    // This node is the only node, do nothing.
    if (get_num_voting_members() <= 1) {
        p_er("this node is the only node in the cluster, will do nothing");
        return;
    }

    recur_lock(lock_);

    if (immediate_yield) {
        p_in("got immediate re-elect request, resign now");
        leader_ = -1;
        become_follower();
        // Clear live flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    // Not immediate yield, nominate the successor.
    int max_priority = 0;
    int candidate_id = -1;
    uint64_t last_resp_ms = 0;
    std::string candidate_endpoint;
    size_t hb_interval_ms = ctx_->get_params()->heart_beat_interval_;
    if (successor_id >= 0) {
        // If successor is given, find that one.
        auto entry = peers_.find(successor_id);
        if (entry != peers_.end()) {
            int32 srv_id = entry->first;
            ptr<peer>& pp = entry->second;
            max_priority = pp->get_config().get_priority();
            candidate_id = srv_id;
            candidate_endpoint = pp->get_config().get_endpoint();
            last_resp_ms = pp->get_resp_timer_us() / 1000;
        }
    }

    // Successor is not given or the given successor is incorrect,
    // find the highest priority node whose response time is not expired.
    if (candidate_id == -1) {
        for (auto& entry: peers_) {
            int32 srv_id = entry.first;
            ptr<peer>& pp = entry.second;
            uint64_t pp_last_resp_ms = pp->get_resp_timer_us() / 1000;

            if ( srv_id != id_ &&
                 pp_last_resp_ms <= hb_interval_ms &&
                 pp->get_config().get_priority() > max_priority ) {
                max_priority = pp->get_config().get_priority();
                candidate_id = srv_id;
                candidate_endpoint = pp->get_config().get_endpoint();
                last_resp_ms = pp_last_resp_ms;
            }
        }
    }

    if (successor_id >= 0) {
        p_in("got graceful re-elect request (designated successor %d), "
             "pause write from now",
             successor_id);

        if ( successor_id >= 0 &&
             successor_id != candidate_id ) {
            p_wn("could not find given successor %d", successor_id);
        }

    } else {
        p_in("got graceful re-elect request, pause write from now");
    }

    if (candidate_id > -1) {
        p_in("next leader candidate: id %d endpoint %s priority %d "
             "last response %" PRIu64 " ms ago",
             candidate_id, candidate_endpoint.c_str(), max_priority,
             last_resp_ms);
        next_leader_candidate_ = candidate_id;;
    } else {
        p_wn("cannot find valid candidate for next leader, will proceed anyway");
    }

    // Reset reelection timer, and pause write.
    write_paused_ = true;

    // Wait until election timeout upper bound.
    reelection_timer_.set_duration_ms
                      ( ctx_->get_params()->election_timeout_upper_bound_ );
    reelection_timer_.reset();
}